

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O2

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
* __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
FastGeneralizationsIterator::next
          (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
           *__return_storage_ptr__,FastGeneralizationsIterator *this)

{
  bool bVar1;
  int iVar2;
  Lhs *pLVar3;
  GenMatcher *this_00;
  undefined1 local_48 [32];
  undefined4 extraout_var;
  
  this_00 = (GenMatcher *)local_48;
  do {
    iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 != '\0') break;
    bVar1 = findNextLeaf(this);
  } while (bVar1);
  iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[3])();
  pLVar3 = (Lhs *)CONCAT44(extraout_var,iVar2);
  if (this->_retrieveSubstitution == true) {
    Kernel::Renaming::reset(&this->_resultNormalizer);
    Kernel::Renaming::normalizeVariables
              (&this->_resultNormalizer,
               ((pLVar3->super_SelectedLiteral).cl)->_literals
               [(int)(pLVar3->super_SelectedLiteral).litIdx]);
    this_00 = (GenMatcher *)(local_48 + 0x10);
    SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::getSubstitution
              (this_00,(Renaming *)&this->_subst);
  }
  else {
    local_48._0_8_ = 0;
    local_48._8_8_ = (uint *)0x0;
  }
  Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr
            (&__return_storage_ptr__->unifier,(SmartPtr<Indexing::ResultSubstitution> *)this_00);
  __return_storage_ptr__->data = pLVar3;
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
            ((SmartPtr<Indexing::ResultSubstitution> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastGeneralizationsIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultNormalizer.reset();
    _resultNormalizer.normalizeVariables(ld->key());

    return QueryRes(_subst.getSubstitution(&_resultNormalizer),ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}